

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O1

void __thiscall Entity::rotateCounterClockwise(Entity *this)

{
  int iVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  
  iVar1 = 0x10e;
  if (0 < this->rotation) {
    iVar1 = this->rotation + -0x5a;
  }
  this->rotation = iVar1;
  puVar2 = (undefined8 *)(**(code **)(*(long *)this + 0x40))();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*puVar2,puVar2[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void Entity::rotateCounterClockwise() {
    rotation = rotation > 0 ? (rotation - 90) : 270;
    cout << *toString() << endl;
}